

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BubbleJson.cpp
# Opt level: O0

void __thiscall bubbleJson::BubbleJson::ParseWhitespace(BubbleJson *this)

{
  bool bVar1;
  char *local_18;
  char *p;
  BubbleJson *this_local;
  
  local_18 = this->context->json;
  while( true ) {
    bVar1 = true;
    if (((*local_18 != ' ') && (bVar1 = true, *local_18 != '\n')) &&
       (bVar1 = true, *local_18 != '\t')) {
      bVar1 = *local_18 == '\r';
    }
    if (!bVar1) break;
    local_18 = local_18 + 1;
  }
  this->context->json = local_18;
  return;
}

Assistant:

void BubbleJson::ParseWhitespace()
{
    const char *p = this->context->json;
    while (*p == ' ' || *p == '\n' || *p == '\t' || *p == '\r')
        p++;
    this->context->json = p;
}